

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

from_chars_result
absl::lts_20250127::from_chars
          (Nonnull<const_char_*> first,Nonnull<const_char_*> last,double *value,chars_format fmt)

{
  from_chars_result fVar1;
  from_chars_result fVar2;
  chars_format fmt_local;
  double *value_local;
  Nonnull<const_char_*> last_local;
  Nonnull<const_char_*> first_local;
  
  fVar1 = anon_unknown_0::FromCharsImpl<double>(first,last,value,fmt);
  fVar2._12_4_ = 0;
  fVar2.ptr = (Nonnull<const_char_*>)SUB128(fVar1._0_12_,0);
  fVar2.ec = SUB124(fVar1._0_12_,8);
  return fVar2;
}

Assistant:

from_chars_result from_chars(absl::Nonnull<const char*> first,
                             absl::Nonnull<const char*> last, double& value,
                             chars_format fmt) {
  return FromCharsImpl(first, last, value, fmt);
}